

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void lj_parse_keepcdata(LexState *ls,TValue *tv,GCcdata *cd)

{
  lua_State *L_00;
  TValue *pTVar1;
  cTValue *in_RDX;
  GCtab *in_RSI;
  long in_RDI;
  lua_State *L;
  
  L_00 = *(lua_State **)(in_RDI + 8);
  (in_RSI->nextgc).gcptr32 = (uint32_t)in_RDX;
  in_RSI->marked = 0xf5;
  in_RSI->gct = 0xff;
  in_RSI->nomm = 0xff;
  in_RSI->colo = -1;
  pTVar1 = lj_tab_set(L_00,in_RSI,in_RDX);
  (pTVar1->field_2).it = 0xfffffffd;
  return;
}

Assistant:

void lj_parse_keepcdata(LexState *ls, TValue *tv, GCcdata *cd)
{
  /* NOBARRIER: the key is new or kept alive. */
  lua_State *L = ls->L;
  setcdataV(L, tv, cd);
  setboolV(lj_tab_set(L, ls->fs->kt, tv), 1);
}